

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O1

void __thiscall llvm::FoldingSetNodeID::AddInteger(FoldingSetNodeID *this,unsigned_long I)

{
  undefined8 in_RAX;
  uint local_18;
  uint local_14;
  
  _local_18 = CONCAT44((uint)((ulong)in_RAX >> 0x20),(int)I);
  SmallVectorTemplateBase<unsigned_int,_true>::push_back
            ((SmallVectorTemplateBase<unsigned_int,_true> *)this,&local_18);
  _local_18 = CONCAT44((int)(I >> 0x20),local_18);
  SmallVectorTemplateBase<unsigned_int,_true>::push_back
            ((SmallVectorTemplateBase<unsigned_int,_true> *)this,&local_14);
  return;
}

Assistant:

void FoldingSetNodeID::AddInteger(unsigned long I) {
  if (sizeof(long) == sizeof(int))
    AddInteger(unsigned(I));
  else if (sizeof(long) == sizeof(long long)) {
    AddInteger((unsigned long long)I);
  } else {
    llvm_unreachable("unexpected sizeof(long)");
  }
}